

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaConLaw.h
# Opt level: O2

void __thiscall NaControlLawItem::~NaControlLawItem(NaControlLawItem *this)

{
  NaConfigPart::~NaConfigPart(&this->super_NaConfigPart);
  operator_delete(this,0x40);
  return;
}

Assistant:

class PNNA_API NaControlLawItem : public NaConfigPart
{
public:
    NaControlLawItem ();

    NaControlLawKind    kind;
    NaReal              value;      // Relative value
    NaReal              duration;   // How long lasts, s
    NaReal              period;     // For periodic laws, s

    // Compute x=f(t) considering that for periodic kinds
    // x is relative to some base level.  Duration is not
    // considered at all.  Time is counted from zero.
    NaReal      Function (NaReal time, NaReal Dt);

    //***********************************************************************
    // Store and retrieve configuration data
    //***********************************************************************

    // Store configuration data in internal order to given stream
    virtual void    Save (NaDataStream& ds);

    // Retrieve configuration data in internal order from given stream
    virtual void    Load (NaDataStream& ds);

}